

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<$_6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&>::operator()
          (result *__return_storage_ptr__,
          expression_lhs<__6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&> *this,
          logic_t *rhs)

{
  int iVar1;
  int iVar2;
  lest *this_00;
  ostream *poVar3;
  logic_t *item;
  logic_t *item_00;
  ostringstream os;
  allocator<char> local_221;
  string local_220 [32];
  string local_200 [32];
  ForNonContainerNonPointer<logic_t,_std::string> local_1e0;
  ForNonContainerNonPointer<logic_t,_std::string> local_1c0;
  ostringstream local_1a0 [376];
  
  this_00 = *(lest **)this;
  iVar1 = rhs->value;
  iVar2 = *(int *)this_00;
  std::__cxx11::string::string<std::allocator<char>>(local_220,"==",&local_221);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  lest::operator()(&local_1c0,this_00,item);
  poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_220);
  poVar3 = std::operator<<(poVar3," ");
  lest::operator()(&local_1e0,(lest *)rhs,item_00);
  std::operator<<(poVar3,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  __return_storage_ptr__->passed = iVar2 == iVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }